

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

void uv__signal_handler(int signum)

{
  int iVar1;
  uv_signal_s *puVar2;
  int iVar3;
  int *piVar4;
  uv_signal_s *puVar5;
  ulong uVar6;
  uv_signal_t *puVar7;
  bool bVar8;
  uv__signal_msg_t msg;
  uv_signal_t *local_48;
  undefined8 uStack_40;
  
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  local_48 = (uv_signal_t *)0x0;
  uStack_40 = 0;
  iVar3 = uv__signal_lock();
  if (iVar3 == 0) {
    puVar5 = uv__signal_first_handle(signum);
    do {
      if ((puVar5 == (uv_signal_t *)0x0) || (puVar5->signum != signum)) goto LAB_0010ec59;
      uVar6 = (ulong)uStack_40 >> 0x20;
      uStack_40 = CONCAT44((int)uVar6,signum);
      local_48 = puVar5;
      do {
        uVar6 = write(puVar5->loop->signal_pipefd[1],&local_48,0x10);
        iVar3 = (int)uVar6;
        if ((uVar6 & 0xffffffff) != 0xffffffff) break;
      } while (*piVar4 == 4);
      if ((iVar3 != 0x10) && ((iVar3 != -1 || (*piVar4 != 0xb)))) {
        __assert_fail("r == sizeof msg || (r == -1 && (errno == EAGAIN || errno == EWOULDBLOCK))",
                      "src/unix/signal.c",0xa6,"void uv__signal_handler(int)");
      }
      if (iVar3 != -1) {
        puVar5->caught_signals = puVar5->caught_signals + 1;
      }
      puVar2 = (puVar5->tree_entry).rbe_right;
      if (puVar2 == (uv_signal_s *)0x0) {
        puVar2 = (puVar5->tree_entry).rbe_parent;
        puVar7 = puVar5;
        if ((puVar2 == (uv_signal_s *)0x0) ||
           (bVar8 = (puVar2->tree_entry).rbe_left != puVar5, puVar5 = puVar2, bVar8)) {
          do {
            puVar5 = (puVar7->tree_entry).rbe_parent;
            if (puVar5 == (uv_signal_s *)0x0) break;
            bVar8 = puVar7 == (puVar5->tree_entry).rbe_right;
            puVar7 = puVar5;
          } while (bVar8);
        }
      }
      else {
        do {
          puVar5 = puVar2;
          puVar2 = (puVar5->tree_entry).rbe_left;
        } while (puVar2 != (uv_signal_s *)0x0);
      }
    } while( true );
  }
LAB_0010ec5e:
  *piVar4 = iVar1;
  return;
LAB_0010ec59:
  uv__signal_unlock();
  goto LAB_0010ec5e;
}

Assistant:

static void uv__signal_handler(int signum) {
  uv__signal_msg_t msg;
  uv_signal_t* handle;
  int saved_errno;

  saved_errno = errno;
  memset(&msg, 0, sizeof msg);

  if (uv__signal_lock()) {
    errno = saved_errno;
    return;
  }

  for (handle = uv__signal_first_handle(signum);
       handle != NULL && handle->signum == signum;
       handle = RB_NEXT(uv__signal_tree_s, &uv__signal_tree, handle)) {
    int r;

    msg.signum = signum;
    msg.handle = handle;

    /* write() should be atomic for small data chunks, so the entire message
     * should be written at once. In theory the pipe could become full, in
     * which case the user is out of luck.
     */
    do {
      r = write(handle->loop->signal_pipefd[1], &msg, sizeof msg);
    } while (r == -1 && errno == EINTR);

    assert(r == sizeof msg ||
           (r == -1 && (errno == EAGAIN || errno == EWOULDBLOCK)));

    if (r != -1)
      handle->caught_signals++;
  }

  uv__signal_unlock();
  errno = saved_errno;
}